

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

Task * __thiscall
depspawn::internal::TaskPool::
build_task<std::function<void(int&)>const&,std::reference_wrapper<int>>
          (TaskPool *this,Workitem *ctx,function<void_(int_&)> *f,reference_wrapper<int> *args)

{
  Task *pTVar1;
  _Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *args_2;
  long in_RDI;
  reference_wrapper<int> *__args;
  function<void_(int_&)> *in_stack_ffffffffffffff98;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *in_stack_ffffffffffffffa0;
  reference_wrapper<int> local_50 [10];
  
  args_2 = (_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *)(in_RDI + 0x1d8);
  __args = local_50;
  std::bind<std::function<void(int&)>const&,std::reference_wrapper<int>>
            (in_stack_ffffffffffffff98,__args);
  pTVar1 = LinkedListPool<depspawn::internal::TaskPool::Task,false,false>::
           malloc<depspawn::internal::TaskPool*,depspawn::internal::Workitem*&,std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>>
                     (in_stack_ffffffffffffffa0,(TaskPool **)in_stack_ffffffffffffff98,
                      (Workitem **)__args,args_2);
  std::_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)>::~_Bind
            ((_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *)0x12ad42);
  return pTVar1;
}

Assistant:

Task *build_task(Workitem *ctx, F&& f, Args&&... args)
  {
    return task_pool_.malloc(this, ctx, std::bind(std::forward<F>(f), std::forward<Args>(args)...));
  }